

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::DictionaryTypeHandlerBase<int>::AddProperty
          (DictionaryTypeHandlerBase<int> *this,DynamicObject *instance,
          PropertyRecord *propertyRecord,Var value,PropertyAttributes attributes,
          PropertyValueInfo *info,PropertyOperationFlags flags,bool throwIfNotExtensible,
          SideEffects possibleSideEffects)

{
  Type *pTVar1;
  uint propertyKey;
  int iVar2;
  ScriptContext *scriptContext;
  RecyclerWeakReference<Js::DynamicObject> *pRVar3;
  JavascriptLibrary *library;
  code *pcVar4;
  Var aValue;
  bool bVar5;
  bool bVar6;
  BOOL BVar7;
  undefined4 *puVar8;
  undefined7 in_register_00000081;
  DictionaryPropertyDescriptor<int> *local_80;
  DictionaryPropertyDescriptor<int> *descriptor;
  undefined1 local_6c [8];
  DictionaryPropertyDescriptor<int> newDescriptor;
  PropertyRecord *local_40;
  PropertyRecord *propertyRecord_local;
  
  propertyRecord_local._4_4_ = (uint)CONCAT71(in_register_00000081,attributes);
  local_40 = propertyRecord;
  if (instance == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x862,"(instance)","instance");
    if (!bVar5) goto LAB_00c3065e;
    *puVar8 = 0;
  }
  scriptContext =
       (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  propertyKey = propertyRecord->pid;
  bVar5 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,&local_40,&local_80);
  if (bVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x868,
                                "(!propertyMap->TryGetReference(propertyRecord, &descriptor))",
                                "!propertyMap->TryGetReference(propertyRecord, &descriptor)");
    if (!bVar5) goto LAB_00c3065e;
    *puVar8 = 0;
  }
  if (local_40->isNumeric == true) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x869,"(!propertyRecord->IsNumeric())",
                                "!propertyRecord->IsNumeric()");
    if (!bVar5) goto LAB_00c3065e;
    *puVar8 = 0;
  }
  unique0x10000657 = value;
  if (((flags & PropertyOperation_Force) == PropertyOperation_None) &&
     (bVar5 = DynamicTypeHandler::VerifyIsExtensible
                        (&this->super_DynamicTypeHandler,scriptContext,throwIfNotExtensible), !bVar5
     )) {
    return 0;
  }
  iVar2 = (this->super_DynamicTypeHandler).slotCapacity;
  if (iVar2 <= this->nextPropertyIndex) {
    if (0x3ffffffe < iVar2) {
      Throw::OutOfMemory();
    }
    EnsureSlotCapacity(this,instance,1);
  }
  local_6c._4_4_ = ::Math::PostInc<int>(&this->nextPropertyIndex);
  local_6c[0] = PreventFalseReference;
  local_6c[1] = (PropertyAttributes)propertyRecord_local._4_4_;
  newDescriptor.flags = ~None;
  newDescriptor.Attributes = 0xff;
  newDescriptor._2_2_ = 0xffff;
  newDescriptor.Data = -1;
  newDescriptor.Getter = local_6c._4_4_;
  if (((this->super_DynamicTypeHandler).flags & 0x18) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x884,"(!GetIsOrMayBecomeShared())","!GetIsOrMayBecomeShared()");
    if (!bVar5) goto LAB_00c3065e;
    *puVar8 = 0;
  }
  aValue = stack0xffffffffffffffa8;
  pRVar3 = (this->singletonInstance).ptr;
  if (pRVar3 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
    if ((DynamicObject *)(pRVar3->super_RecyclerWeakReferenceBase).strongRef == instance) {
      if (((flags & PropertyOperation_PreInit) == PropertyOperation_None) &&
         (local_6c[0] = IsInitialized|PreventFalseReference,
         (flags & (PropertyOperation_NonFixedValue|PropertyOperation_SpecialValue)) ==
         PropertyOperation_None && 0xf < propertyKey)) {
        if (stack0xffffffffffffffa8 == (Var)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar8 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                      ,0x88f,"(value != nullptr)","value != nullptr");
          if (!bVar5) goto LAB_00c3065e;
          *puVar8 = 0;
        }
        BVar7 = RecyclableObject::IsExternal(&instance->super_RecyclableObject);
        if (BVar7 != 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar8 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                      ,0x891,"(!instance->IsExternal())","!instance->IsExternal()");
          if (!bVar5) goto LAB_00c3065e;
          *puVar8 = 0;
        }
        bVar5 = VarIs<Js::JavascriptFunction>(aValue);
        if (bVar5) {
          bVar6 = DynamicTypeHandler::ShouldFixMethodProperties();
        }
        else {
          bVar5 = DynamicTypeHandler::ShouldFixDataProperties();
          bVar6 = DynamicTypeHandler::CheckHeuristicsForFixedDataProps(instance,local_40,aValue);
          bVar6 = bVar6 && bVar5;
        }
        local_6c[0] = bVar6 << 5 | (IsInitialized|PreventFalseReference);
      }
      goto LAB_00c30541;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x887,
                                "(this->singletonInstance == nullptr || localSingletonInstance == instance)"
                                ,
                                "this->singletonInstance == nullptr || localSingletonInstance == instance"
                               );
    if (!bVar5) {
LAB_00c3065e:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar8 = 0;
  }
  if ((flags & PropertyOperation_PreInit) == PropertyOperation_None) {
    local_6c[0] = IsInitialized|PreventFalseReference;
  }
LAB_00c30541:
  JsUtil::
  BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::
  Insert<(JsUtil::BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
            ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)(this->propertyMap).ptr,&local_40,(DictionaryPropertyDescriptor<int> *)local_6c);
  if ((propertyRecord_local._4_4_ & 1) != 0) {
    DynamicObject::SetHasNoEnumerableProperties(instance,false);
  }
  library = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::WriteBarrierSet
            ((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *)&descriptor
             ,&library->typesWithOnlyWritablePropertyProtoChain);
  PrototypeChainCache<Js::OnlyWritablePropertyCache>::ProcessProperty<int>
            ((PrototypeChainCache<Js::OnlyWritablePropertyCache> *)descriptor,
             &this->super_DynamicTypeHandler,propertyRecord_local._4_1_,propertyKey,scriptContext);
  bVar5 = NoSpecialPropertyCache::IsSpecialProperty(propertyKey);
  if ((bVar5) &&
     (bVar5 = DynamicTypeHandler::GetHasSpecialProperties(&this->super_DynamicTypeHandler), !bVar5))
  {
    bVar5 = NoSpecialPropertyCache::IsDefaultSpecialProperty(instance,library,propertyKey);
    if (bVar5) {
      if (info != (PropertyValueInfo *)0x0) {
        info->m_instance = &instance->super_RecyclableObject;
        info->m_propertyIndex = 0xffff;
        info->m_attributes = '\0';
        info->flags = InlineCacheNoFlags;
      }
    }
    else {
      pTVar1 = &(this->super_DynamicTypeHandler).propertyTypes;
      *pTVar1 = *pTVar1 | 0x80;
      if (((this->super_DynamicTypeHandler).flags & 0x20) != 0) {
        Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::
        WriteBarrierSet((WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> *)
                        &descriptor,&library->typesWithNoSpecialPropertyProtoChain);
        PrototypeChainCache<Js::NoSpecialPropertyCache>::Clear
                  ((PrototypeChainCache<Js::NoSpecialPropertyCache> *)descriptor);
      }
    }
  }
  DynamicTypeHandler::SetSlotUnchecked(instance,newDescriptor.Getter,stack0xffffffffffffffa8);
  if (info != (PropertyValueInfo *)0x0) {
    info->m_instance = &instance->super_RecyclableObject;
    info->m_propertyIndex = 0xffff;
    info->m_attributes = '\0';
    info->flags = InlineCacheNoFlags;
  }
  ScriptContext::InvalidateProtoCaches(scriptContext,local_40->pid);
  DynamicTypeHandler::SetPropertyUpdateSideEffect
            (&this->super_DynamicTypeHandler,instance,local_40->pid,stack0xffffffffffffffa8,
             possibleSideEffects);
  return 1;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::AddProperty(DynamicObject* instance, const PropertyRecord* propertyRecord, Var value,
        PropertyAttributes attributes, PropertyValueInfo* info, PropertyOperationFlags flags, bool throwIfNotExtensible, SideEffects possibleSideEffects)
    {
        AnalysisAssert(instance);
        ScriptContext* scriptContext = instance->GetScriptContext();
        bool isForce = (flags & PropertyOperation_Force) != 0;
        PropertyId propertyId = propertyRecord->GetPropertyId();
#if DBG
        DictionaryPropertyDescriptor<T>* descriptor;
        Assert(!propertyMap->TryGetReference(propertyRecord, &descriptor));
        Assert(!propertyRecord->IsNumeric());
#endif

        if (!isForce)
        {
            if (!this->VerifyIsExtensible(scriptContext, throwIfNotExtensible))
            {
                return FALSE;
            }
        }

        if (this->GetSlotCapacity() <= nextPropertyIndex)
        {
            if (this->GetSlotCapacity() >= MaxPropertyIndexSize ||
                (this->GetSlotCapacity() >= CONFIG_FLAG(BigDictionaryTypeHandlerThreshold) && !this->IsBigDictionaryTypeHandler()))
            {
                BigDictionaryTypeHandler* newTypeHandler = ConvertToBigDictionaryTypeHandler(instance);

                return newTypeHandler->AddProperty(instance, propertyRecord, value, attributes, info, flags, false, possibleSideEffects);
            }
            this->EnsureSlotCapacity(instance);
        }

        T index = ::Math::PostInc(nextPropertyIndex);
        DictionaryPropertyDescriptor<T> newDescriptor(index, attributes);

        // DictionaryTypeHandlers are not supposed to be shared.
        Assert(!GetIsOrMayBecomeShared());
#if ENABLE_FIXED_FIELDS
        DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
        Assert(this->singletonInstance == nullptr || localSingletonInstance == instance);

        if ((flags & PropertyOperation_PreInit) == 0)
        {
            newDescriptor.SetIsInitialized(true);
            if (localSingletonInstance == instance && !IsInternalPropertyId(propertyId) &&
                (flags & (PropertyOperation_NonFixedValue | PropertyOperation_SpecialValue)) == 0)
            {
                Assert(value != nullptr);
                // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
                Assert(!instance->IsExternal());
                newDescriptor.SetIsFixed(VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : (ShouldFixDataProperties() & CheckHeuristicsForFixedDataProps(instance, propertyRecord, value)));
            }
        }
#endif

        propertyMap->Add(propertyRecord, newDescriptor);

        if (attributes & PropertyEnumerable)
        {
            instance->SetHasNoEnumerableProperties(false);
        }
        JavascriptLibrary* library = scriptContext->GetLibrary();

        library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, attributes, propertyId, scriptContext);
        if (NoSpecialPropertyCache::IsSpecialProperty(propertyId) && !this->GetHasSpecialProperties())
        {
            if (!NoSpecialPropertyCache::IsDefaultSpecialProperty(instance, library, propertyId))
            {
                this->SetHasSpecialProperties();
                if (GetFlags() & IsPrototypeFlag)
                {
                    library->GetTypesWithNoSpecialPropertyProtoChainCache()->Clear();
                }
            }
            else
            {
                PropertyValueInfo::SetNoCache(info, instance);
            }
        }

        SetSlotUnchecked(instance, index, value);

#if ENABLE_FIXED_FIELDS
        // If we just added a fixed method, don't populate the inline cache so that we always take the
        // slow path when overwriting this property and correctly invalidate any JIT-ed code that hard-coded
        // this method.
        if (newDescriptor.GetIsFixed())
        {
            PropertyValueInfo::SetNoCache(info, instance);
        }
        else
#endif
        {
            SetPropertyValueInfoNonFixed(info, instance, index, attributes);
        }

        // Always invalidate prototype caches when we add a property.  Previously, we only did this if the current
        // type is used as a prototype, or if the new property is also found on the prototype chain (because
        // adding a new field doesn't create a new dictionary type).  However, if the new property is already in
        // the cache as a missing property, we have to invalidate the prototype caches.
        scriptContext->InvalidateProtoCaches(propertyRecord->GetPropertyId());

        SetPropertyUpdateSideEffect(instance, propertyRecord->GetPropertyId(), value, possibleSideEffects);
        return true;
    }